

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O0

void ConcurrentCheckpoint::WriteRandomNumbers(DuckDB *db,bool *correct,size_t nr)

{
  byte bVar1;
  __int_type _Var2;
  ulong in_RDX;
  long in_RSI;
  DuckDB *in_RDI;
  size_t i;
  Connection con;
  byte in_stack_fffffffffffffc3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  byte in_stack_fffffffffffffc7f;
  allocator local_349;
  string local_348 [32];
  string local_328 [8];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [8];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [8];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [8];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [31];
  allocator local_69;
  string local_68 [32];
  string local_48 [8];
  ulong local_40;
  Connection local_38 [32];
  ulong local_18;
  long local_10;
  
  *(undefined1 *)(in_RSI + in_RDX) = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  duckdb::Connection::Connection(local_38,in_RDI);
  for (local_40 = 0; local_40 < 200; local_40 = local_40 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"BEGIN TRANSACTION",&local_69);
    duckdb::Connection::Query(local_48);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffc40);
    bVar1 = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78b473);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
    duckdb::Connection::Query(local_88);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffc40);
    bVar1 = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78b5f8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
    duckdb::Connection::Query(local_130);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffc40);
    in_stack_fffffffffffffc7f = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78b82c);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    if ((in_stack_fffffffffffffc7f & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
    duckdb::Connection::Query(local_1d8);
    in_stack_fffffffffffffc70 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         duckdb::
         unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
         ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                       *)in_stack_fffffffffffffc40);
    bVar1 = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78ba4a);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_258);
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
    duckdb::Connection::Query(local_280);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffc40);
    bVar1 = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78bc65);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_300);
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    in_stack_fffffffffffffc48 = "ROLLBACK";
    if ((local_18 & 1) == 0) {
      in_stack_fffffffffffffc48 = "COMMIT";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,in_stack_fffffffffffffc48,&local_349);
    duckdb::Connection::Query(local_328);
    in_stack_fffffffffffffc40 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         duckdb::
         unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
         ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                       *)in_stack_fffffffffffffc40);
    in_stack_fffffffffffffc3f = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78be40);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    if ((in_stack_fffffffffffffc3f & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
  }
  std::__atomic_base<unsigned_long>::operator++
            (&finished_threads.super___atomic_base<unsigned_long>,0);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc48);
  if (_Var2 == 10) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffc40,(bool)in_stack_fffffffffffffc3f);
  }
  duckdb::Connection::~Connection(local_38);
  return;
}

Assistant:

static void WriteRandomNumbers(DuckDB *db, bool *correct, size_t nr) {
		correct[nr] = true;
		Connection con(*db);
		for (size_t i = 0; i < CONCURRENT_UPDATE_TRANSACTION_UPDATE_COUNT; i++) {
			// just make some changes to the total
			// the total amount of money after the commit is the same
			if (con.Query("BEGIN TRANSACTION")->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money + " + to_string(i * 2) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money - " + to_string(i) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money - " + to_string(i * 2) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money + " + to_string(i) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			// we test both commit and rollback
			// the result of both should be the same since the updates have a
			// net-zero effect
			if (con.Query(nr % 2 == 0 ? "COMMIT" : "ROLLBACK")->HasError()) {
				correct[nr] = false;
			}
		}
		finished_threads++;
		if (finished_threads == CONCURRENT_UPDATE_TOTAL_ACCOUNTS) {
			finished = true;
		}
	}